

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QHostAddress::operator==(QHostAddress *this,SpecialAddress other)

{
  quint64 qVar1;
  unsigned_long_long uVar2;
  QHostAddressPrivate *pQVar3;
  undefined4 in_ESI;
  quint64 second;
  quint32 ip4;
  bool local_41;
  bool local_31;
  quint32 local_18;
  
  local_18 = 0;
  switch(in_ESI) {
  case 0:
    pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217956);
    return pQVar3->protocol == -1;
  case 1:
    local_18 = 0xffffffff;
    break;
  case 2:
    local_18 = 0x7f000001;
    break;
  case 3:
  case 5:
    pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2179b3);
    if (pQVar3->protocol == '\x01') {
      pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2179d8);
      local_31 = false;
      if ((pQVar3->field_1).a6_64.c[0] == 0) {
        pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2179f2);
        qVar1 = (pQVar3->field_1).a6_64.c[1];
        uVar2 = qToBigEndian<unsigned_long_long>(0x217a05);
        local_31 = qVar1 == uVar2;
      }
      return local_31;
    }
    return false;
  case 4:
    pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21798f);
    return pQVar3->protocol == '\x02';
  case 6:
  }
  pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217a34);
  local_41 = false;
  if (pQVar3->protocol == '\0') {
    pQVar3 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217a4d);
    local_41 = pQVar3->a == local_18;
  }
  return local_41;
}

Assistant:

bool QHostAddress::operator ==(SpecialAddress other) const
{
    quint32 ip4 = INADDR_ANY;
    switch (other) {
    case Null:
        return d->protocol == QHostAddress::UnknownNetworkLayerProtocol;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;

    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;

    case Any:
        return d->protocol == QHostAddress::AnyIPProtocol;

    case AnyIPv4:
        break;

    case LocalHostIPv6:
    case AnyIPv6:
        if (d->protocol == QHostAddress::IPv6Protocol) {
            quint64 second = quint8(other == LocalHostIPv6);  // 1 for localhost, 0 for any
            return d->a6_64.c[0] == 0 && d->a6_64.c[1] == qToBigEndian(second);
        }
        return false;
    }

    // common IPv4 part
    return d->protocol == QHostAddress::IPv4Protocol && d->a == ip4;
}